

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Ref RVar4;
  undefined1 *puVar5;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  RVar3.inst = cashew::Value::setArray(pVVar2,2);
  cashew::Value::push_back(RVar3.inst,(Value *)target.str._M_str);
  cashew::Value::push_back(RVar3.inst,args);
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,3);
  puVar5 = &DAT_00000018;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar4.inst)->type = Null;
  cashew::Value::free(RVar4.inst,puVar5);
  (RVar4.inst)->type = String;
  pcVar1 = DAT_00da8aa0;
  ((RVar4.inst)->field_1).str.str._M_len = CALL;
  ((RVar4.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar4);
  puVar5 = &DAT_00000018;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar4.inst)->type = Null;
  cashew::Value::free(RVar4.inst,puVar5);
  (RVar4.inst)->type = String;
  ((RVar4.inst)->field_1).arr = (ArrayStorage *)this;
  ((RVar4.inst)->field_1).str.str._M_str = (char *)target.str._M_len;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar4);
  RVar3.inst = cashew::Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }